

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.util.c
# Opt level: O3

void pnga_print_patch_file(FILE *file,Integer g_a,Integer *lo,Integer *hi,Integer pretty)

{
  float fVar1;
  ulong uVar2;
  int iVar3;
  Integer *pIVar4;
  Integer IVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  double *pdVar12;
  char *pcVar13;
  long lVar14;
  double *pdVar15;
  ulong uVar16;
  double *pdVar17;
  double *pdVar18;
  double *pdVar19;
  float *pfVar20;
  size_t __n;
  long lVar21;
  float *pfVar22;
  long *plVar23;
  double dVar24;
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Integer ndim;
  Integer hip [7];
  Integer lop [7];
  Integer type;
  char *name;
  Integer ld [7];
  Integer dims [7];
  float fbuf [6];
  int ibuf [6];
  DoublePrecision dbuf_2d [36];
  longlong llbuf [6];
  long lbuf [6];
  DoublePrecision dbuf [6];
  DoublePrecision dcbuf [12];
  ulong local_a30 [9];
  Integer local_9e8;
  ulong local_9e0 [9];
  long *local_998;
  long local_990;
  Integer *local_988;
  char *local_980;
  long local_978;
  long local_970;
  double *local_968;
  double *local_960;
  double *local_958;
  double *local_950;
  double *local_948;
  ulong local_940;
  Integer local_938;
  long alStack_930 [6];
  long local_900;
  long local_8f8;
  ulong local_8f0;
  Integer local_8e8 [8];
  double local_8a8 [18];
  double local_818 [18];
  undefined8 local_788;
  double local_668 [36];
  double local_548 [36];
  undefined8 local_428;
  double local_278 [73];
  
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  pnga_sync();
  pnga_check_handle(g_a,"nga_print");
  IVar5 = pnga_nodeid();
  if (IVar5 != 0) goto LAB_0015ccd9;
  local_9e0[0] = pretty;
  local_998 = hi;
  pnga_inquire(g_a,&local_990,(Integer *)local_a30,local_8e8);
  pnga_inquire_name(g_a,&local_980);
  if (0 < (long)local_a30[0]) {
    lVar11 = 0;
    uVar7 = local_a30[0];
    do {
      if ((lo[lVar11] < 1) || (local_8e8[lVar11] < local_998[lVar11])) {
        pnga_error("g_a indices out of range ",g_a);
        uVar7 = local_a30[0];
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (long)uVar7);
  }
  local_9e8 = g_a;
  fprintf((FILE *)file,"\n global array: %s[",local_980);
  plVar23 = local_998;
  if (0 < (long)local_a30[0]) {
    lVar11 = 0;
    do {
      pcVar13 = "%ld:%ld,";
      if (lVar11 == local_a30[0] - 1) {
        pcVar13 = "%ld:%ld";
      }
      fprintf((FILE *)file,pcVar13,lo[lVar11],plVar23[lVar11]);
      lVar11 = lVar11 + 1;
    } while (lVar11 < (long)local_a30[0]);
  }
  local_988 = lo;
  fprintf((FILE *)file,"],  handle: %d \n",local_9e8);
  pIVar4 = local_988;
  plVar23 = local_998;
  lVar11 = (ulong)(local_990 != 0x3ee) * 3;
  lVar21 = lVar11 + 3;
  local_970 = lVar21;
  if ((long)local_a30[0] < 1) {
    if (local_9e0[0] != 0) goto LAB_0015bb7d;
LAB_0015c8cd:
    local_9e0[0] = lVar11 + 2;
    local_a30[1] = local_9e0[1] + local_9e0[0];
    if (*plVar23 <= (long)(local_9e0[1] + local_9e0[0])) {
      local_a30[1] = *plVar23;
    }
    do {
      do {
        switch(local_990) {
        case 0x3e9:
          pdVar18 = local_818;
          break;
        case 0x3ea:
          pdVar18 = local_548;
          break;
        case 0x3eb:
          pdVar18 = local_8a8;
          break;
        case 0x3ec:
          pdVar18 = (double *)&local_428;
          break;
        default:
          pnga_error("ga_print: wrong type",0);
          goto LAB_0015ca00;
        case 0x3ee:
          pdVar18 = (double *)&local_788;
          break;
        case 0x3ef:
          pdVar18 = local_278;
          break;
        case 0x3f8:
          pdVar18 = local_668;
        }
        pnga_get(local_9e8,(Integer *)(local_9e0 + 1),(Integer *)(local_a30 + 1),pdVar18,&local_938)
        ;
LAB_0015ca00:
        if ((long)local_9e0[1] <= (long)local_a30[1]) {
          lVar11 = 0;
          do {
            fprintf((FILE *)file,"%s(",local_980);
            if (0 < (long)local_a30[0]) {
              lVar21 = 0;
              do {
                if (local_a30[0] == 1) {
                  lVar8 = local_9e0[1] + lVar11;
LAB_0015ca5b:
                  pcVar13 = "%ld";
                }
                else {
                  if (lVar21 == 0) {
                    lVar8 = local_9e0[1] + lVar11;
                  }
                  else {
                    lVar8 = local_9e0[lVar21 + 1];
                    if (lVar21 == local_a30[0] - 1) goto LAB_0015ca5b;
                  }
                  pcVar13 = "%ld,";
                }
                fprintf((FILE *)file,pcVar13,lVar8);
                lVar21 = lVar21 + 1;
              } while (lVar21 < (long)local_a30[0]);
            }
            switch(local_990) {
            case 0x3e9:
              fprintf((FILE *)file,") = %d\n",(ulong)*(uint *)((long)local_818 + lVar11 * 4));
              break;
            case 0x3ea:
              dVar24 = local_548[lVar11];
              pcVar13 = ") = %ld\n";
              goto LAB_0015cb3a;
            case 0x3eb:
              dVar24 = (double)*(float *)((long)local_8a8 + lVar11 * 4);
LAB_0015cb6d:
              pcVar13 = ") = %f\n";
              goto LAB_0015cbeb;
            case 0x3ec:
              dVar24 = (double)(&local_428)[lVar11];
              if (dVar24 < 100000.0) goto LAB_0015cb6d;
              pcVar13 = ") = %e\n";
LAB_0015cbeb:
              fprintf((FILE *)file,pcVar13,dVar24);
              break;
            case 0x3ee:
              dVar24 = (double)*(float *)(&local_788 + lVar11);
              lVar21 = lVar11 * 2 + 1;
              if ((100000.0 <= *(float *)(&local_788 + lVar11)) ||
                 (fVar1 = *(float *)((long)&local_788 + lVar21 * 4), 100000.0 <= fVar1)) {
                dVar26 = (double)*(float *)((long)&local_788 + lVar21 * 4);
                goto LAB_0015cbce;
              }
              dVar26 = (double)fVar1;
LAB_0015cbb6:
              pcVar13 = ") = (%f,%f)\n";
              goto LAB_0015cbd8;
            case 0x3ef:
              dVar24 = local_278[lVar11 * 2];
              lVar21 = lVar11 * 2 + 1;
              if ((dVar24 < 100000.0) && (dVar26 = local_278[lVar21], dVar26 < 100000.0))
              goto LAB_0015cbb6;
              dVar26 = local_278[lVar21];
LAB_0015cbce:
              pcVar13 = ") = (%e,%e)\n";
LAB_0015cbd8:
              fprintf((FILE *)file,pcVar13,dVar24,dVar26);
              break;
            case 0x3f8:
              dVar24 = local_668[lVar11];
              pcVar13 = ") = %lld\n";
LAB_0015cb3a:
              fprintf((FILE *)file,pcVar13,dVar24);
            }
            bVar6 = lVar11 < (long)(local_a30[1] - local_9e0[1]);
            lVar11 = lVar11 + 1;
          } while (bVar6);
        }
        fflush((FILE *)file);
        plVar23 = local_998;
        uVar7 = local_9e0[0];
        local_9e0[1] = local_a30[1] + 1;
        local_a30[1] = local_a30[1] + local_970;
        if (*local_998 <= (long)local_a30[1]) {
          local_a30[1] = *local_998;
        }
      } while ((long)local_a30[0] < 1);
      bVar6 = false;
      uVar10 = 0;
      pIVar4 = local_988;
LAB_0015cc66:
      do {
        uVar9 = uVar10 + 1;
        lVar11 = plVar23[uVar10];
        if (lVar11 < (long)local_9e0[uVar9]) {
          if (uVar9 == local_a30[0]) {
            bVar6 = true;
            uVar10 = uVar9;
            pIVar4 = local_988;
            if (uVar9 == local_a30[0]) goto LAB_0015ccd1;
            goto LAB_0015cc66;
          }
          uVar2 = pIVar4[uVar10];
          local_9e0[uVar9] = uVar2;
          if (uVar9 == 1) {
            local_a30[1] = uVar2 + uVar7;
            if (lVar11 <= (long)(uVar2 + uVar7)) {
              local_a30[1] = lVar11;
            }
          }
          else {
            local_a30[uVar9] = uVar2;
          }
          local_9e0[uVar10 + 2] = local_9e0[uVar10 + 2] + 1;
          local_a30[uVar10 + 2] = local_a30[uVar10 + 2] + 1;
        }
        uVar10 = uVar9;
      } while (uVar9 != local_a30[0]);
    } while (!bVar6);
  }
  else {
    lVar8 = local_a30[0] - 1;
    auVar25._8_4_ = (int)lVar8;
    auVar25._0_8_ = lVar8;
    auVar25._12_4_ = (int)((ulong)lVar8 >> 0x20);
    uVar7 = 0;
    auVar25 = auVar25 ^ _DAT_001b1020;
    auVar27 = _DAT_001b1010;
    do {
      auVar28 = auVar27 ^ _DAT_001b1020;
      if ((bool)(~(auVar28._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar28._0_4_ ||
                  auVar25._4_4_ < auVar28._4_4_) & 1)) {
        alStack_930[uVar7 - 1] = lVar21;
      }
      if ((auVar28._12_4_ != auVar25._12_4_ || auVar28._8_4_ <= auVar25._8_4_) &&
          auVar28._12_4_ <= auVar25._12_4_) {
        alStack_930[uVar7] = lVar21;
      }
      uVar7 = uVar7 + 2;
      lVar8 = auVar27._8_8_;
      auVar27._0_8_ = auVar27._0_8_ + 2;
      auVar27._8_8_ = lVar8 + 2;
    } while ((local_a30[0] + 1 & 0xfffffffffffffffe) != uVar7);
    if (local_9e0[0] == 0) {
      if (0 < (long)local_a30[0]) {
        __n = local_a30[0] << 3;
        memcpy(local_9e0 + 1,local_988,__n);
        memcpy(local_a30 + 1,pIVar4,__n);
      }
      goto LAB_0015c8cd;
    }
    if (0 < (long)local_a30[0]) {
      uVar7 = 0;
      do {
        lVar8 = local_988[uVar7];
        local_9e0[uVar7 + 1] = lVar8;
        if (uVar7 < 2) {
          lVar8 = lVar8 + lVar11 + 2;
          if (plVar23[uVar7] <= lVar8) {
            lVar8 = plVar23[uVar7];
          }
        }
        local_a30[uVar7 + 1] = lVar8;
        uVar7 = uVar7 + 1;
      } while (local_a30[0] != uVar7);
    }
LAB_0015bb7d:
    local_978 = lVar11 + 2;
    iVar3 = (int)lVar21;
    local_9e0[0] = (ulong)(uint)(iVar3 * 8);
    local_8f0 = (ulong)(uint)(iVar3 << 4);
    local_940 = (ulong)(uint)(iVar3 * 4);
    lVar21 = 1;
    lVar11 = 1;
    do {
      do {
        IVar5 = local_9e8;
        if (2 < (long)local_a30[0] && lVar21 != 0) {
          fprintf((FILE *)file,"\n -- patch: %s[",local_980);
          if (0 < (long)local_a30[0]) {
            uVar7 = 0;
            do {
              if (uVar7 < 2) {
                if (uVar7 == local_a30[0] - 1) {
                  pcVar13 = "%ld:%ld";
                }
                else {
                  pcVar13 = "%ld:%ld,";
                }
                fprintf((FILE *)file,pcVar13,local_988[uVar7],plVar23[uVar7]);
              }
              else {
                if (uVar7 == local_a30[0] - 1) {
                  pcVar13 = "%ld";
                }
                else {
                  pcVar13 = "%ld,";
                }
                fprintf((FILE *)file,pcVar13,local_9e0[uVar7 + 1]);
              }
              uVar7 = uVar7 + 1;
            } while ((long)uVar7 < (long)local_a30[0]);
          }
          fwrite("]\n",2,1,(FILE *)file);
          lVar21 = 0;
        }
        local_8f8 = lVar21;
        if ((lVar11 != 0) && (1 < (long)local_a30[0])) {
          fputc(10,(FILE *)file);
          switch(local_990) {
          case 0x3e9:
            fwrite("     ",5,1,(FILE *)file);
            uVar7 = local_9e0[2];
            if ((long)local_9e0[2] <= (long)local_a30[2]) {
              do {
                fprintf((FILE *)file,"%7ld  ",uVar7);
                bVar6 = (long)uVar7 < (long)local_a30[2];
                uVar7 = uVar7 + 1;
              } while (bVar6);
            }
            fwrite("\n      ",7,1,(FILE *)file);
            if ((long)local_9e0[2] <= (long)local_a30[2]) {
              lVar11 = local_9e0[2] + -1;
              do {
                fwrite(" --------",9,1,(FILE *)file);
                lVar11 = lVar11 + 1;
              } while (lVar11 < (long)local_a30[2]);
            }
            break;
          case 0x3ea:
            fwrite("     ",5,1,(FILE *)file);
            uVar7 = local_9e0[2];
            if ((long)local_9e0[2] <= (long)local_a30[2]) {
              do {
                fprintf((FILE *)file,"%7ld  ",uVar7);
                bVar6 = (long)uVar7 < (long)local_a30[2];
                uVar7 = uVar7 + 1;
              } while (bVar6);
            }
            fwrite("\n      ",7,1,(FILE *)file);
            if ((long)local_9e0[2] <= (long)local_a30[2]) {
              lVar11 = local_9e0[2] + -1;
              do {
                fwrite(" --------",9,1,(FILE *)file);
                lVar11 = lVar11 + 1;
              } while (lVar11 < (long)local_a30[2]);
            }
            break;
          case 0x3eb:
            fwrite("     ",5,1,(FILE *)file);
            uVar7 = local_9e0[2];
            if ((long)local_9e0[2] <= (long)local_a30[2]) {
              do {
                fprintf((FILE *)file,"%7ld  ",uVar7);
                bVar6 = (long)uVar7 < (long)local_a30[2];
                uVar7 = uVar7 + 1;
              } while (bVar6);
            }
            fwrite("\n      ",7,1,(FILE *)file);
            if ((long)local_9e0[2] <= (long)local_a30[2]) {
              lVar11 = local_9e0[2] + -1;
              do {
                fwrite(" --------",9,1,(FILE *)file);
                lVar11 = lVar11 + 1;
              } while (lVar11 < (long)local_a30[2]);
            }
            break;
          case 0x3ec:
            fwrite("   ",3,1,(FILE *)file);
            uVar7 = local_9e0[2];
            if ((long)local_9e0[2] <= (long)local_a30[2]) {
              do {
                fprintf((FILE *)file,"%10ld  ",uVar7);
                bVar6 = (long)uVar7 < (long)local_a30[2];
                uVar7 = uVar7 + 1;
              } while (bVar6);
            }
            fwrite("\n      ",7,1,(FILE *)file);
            if ((long)local_9e0[2] <= (long)local_a30[2]) {
              lVar11 = local_9e0[2] + -1;
              do {
                fwrite(" -----------",0xc,1,(FILE *)file);
                lVar11 = lVar11 + 1;
              } while (lVar11 < (long)local_a30[2]);
            }
            break;
          default:
            pnga_error("ga_print: wrong type",0);
            break;
          case 0x3ee:
            uVar7 = local_9e0[2];
            if ((long)local_9e0[2] <= (long)local_a30[2]) {
              do {
                fprintf((FILE *)file,"%22ld  ",uVar7);
                bVar6 = (long)uVar7 < (long)local_a30[2];
                uVar7 = uVar7 + 1;
              } while (bVar6);
            }
            fwrite("\n      ",7,1,(FILE *)file);
            if ((long)local_9e0[2] <= (long)local_a30[2]) {
              lVar11 = local_9e0[2] + -1;
              do {
                fwrite(" -----------------------",0x18,1,(FILE *)file);
                lVar11 = lVar11 + 1;
              } while (lVar11 < (long)local_a30[2]);
            }
            break;
          case 0x3ef:
            uVar7 = local_9e0[2];
            if ((long)local_9e0[2] <= (long)local_a30[2]) {
              do {
                fprintf((FILE *)file,"%22ld  ",uVar7);
                bVar6 = (long)uVar7 < (long)local_a30[2];
                uVar7 = uVar7 + 1;
              } while (bVar6);
            }
            fwrite("\n      ",7,1,(FILE *)file);
            if ((long)local_9e0[2] <= (long)local_a30[2]) {
              lVar11 = local_9e0[2] + -1;
              do {
                fwrite(" -----------------------",0x18,1,(FILE *)file);
                lVar11 = lVar11 + 1;
              } while (lVar11 < (long)local_a30[2]);
            }
            break;
          case 0x3f8:
            fwrite("     ",5,1,(FILE *)file);
            uVar7 = local_9e0[2];
            if ((long)local_9e0[2] <= (long)local_a30[2]) {
              do {
                fprintf((FILE *)file,"%7ld  ",uVar7);
                bVar6 = (long)uVar7 < (long)local_a30[2];
                uVar7 = uVar7 + 1;
              } while (bVar6);
            }
            fwrite("\n      ",7,1,(FILE *)file);
            if ((long)local_9e0[2] <= (long)local_a30[2]) {
              lVar11 = local_9e0[2] + -1;
              do {
                fwrite(" --------",9,1,(FILE *)file);
                lVar11 = lVar11 + 1;
              } while (lVar11 < (long)local_a30[2]);
            }
          }
          fputc(10,(FILE *)file);
          lVar11 = 0;
        }
        local_900 = lVar11;
        switch(local_990) {
        case 0x3e9:
          pdVar18 = local_818;
          break;
        case 0x3ea:
          pdVar18 = local_548;
          break;
        case 0x3eb:
          pdVar18 = local_8a8;
          break;
        case 0x3ec:
          pdVar18 = (double *)&local_788;
          break;
        default:
          pnga_error("ga_print: wrong type",0);
          goto LAB_0015c1ee;
        case 0x3ee:
          pdVar18 = (double *)&local_428;
          break;
        case 0x3ef:
          pdVar18 = local_278;
          break;
        case 0x3f8:
          pdVar18 = local_668;
        }
        pnga_get(IVar5,(Integer *)(local_9e0 + 1),(Integer *)(local_a30 + 1),pdVar18,&local_938);
LAB_0015c1ee:
        if ((long)local_9e0[1] <= (long)local_a30[1]) {
          pdVar18 = local_818;
          local_968 = local_548;
          pdVar19 = local_668;
          pdVar15 = (double *)&local_788;
          pdVar17 = local_8a8;
          pdVar12 = local_278 + 1;
          pfVar22 = (float *)((long)&local_428 + 4);
          lVar11 = 0;
          do {
            local_960 = pdVar17;
            local_958 = pdVar15;
            fprintf((FILE *)file,"%4ld  ",local_9e0[1] + lVar11);
            local_948 = pdVar18;
            local_950 = pdVar19;
            switch(local_990) {
            case 0x3e9:
              if ((long)local_a30[0] < 2) {
                fprintf((FILE *)file," %8d",(ulong)*(uint *)((long)local_818 + lVar11 * 4));
              }
              else if ((long)local_9e0[2] <= (long)local_a30[2]) {
                lVar21 = -1;
                do {
                  fprintf((FILE *)file," %8d",(ulong)*(uint *)pdVar18);
                  lVar21 = lVar21 + 1;
                  pdVar18 = (double *)((long)pdVar18 + local_940);
                } while (lVar21 < (long)(local_a30[2] - local_9e0[2]));
              }
              break;
            case 0x3ea:
              if ((long)local_a30[0] < 2) {
                dVar24 = local_548[lVar11];
                pcVar13 = " %8ld";
LAB_0015c64f:
                fprintf((FILE *)file,pcVar13,dVar24);
              }
              else if ((long)local_9e0[2] <= (long)local_a30[2]) {
                lVar21 = -1;
                pdVar18 = local_968;
                do {
                  fprintf((FILE *)file," %8ld",*pdVar18);
                  lVar21 = lVar21 + 1;
                  pdVar18 = (double *)((long)pdVar18 + local_9e0[0]);
                } while (lVar21 < (long)(local_a30[2] - local_9e0[2]));
              }
              break;
            case 0x3eb:
              if ((long)local_a30[0] < 2) {
                dVar24 = (double)*(float *)((long)local_8a8 + lVar11 * 4);
LAB_0015c680:
                pcVar13 = " %11.5f";
LAB_0015c6fd:
                fprintf((FILE *)file,pcVar13,dVar24);
              }
              else if ((long)local_9e0[2] <= (long)local_a30[2]) {
                lVar21 = -1;
                pdVar18 = local_960;
                do {
                  fprintf((FILE *)file," %11.5f",(double)*(float *)pdVar18);
                  lVar21 = lVar21 + 1;
                  pdVar18 = (double *)((long)pdVar18 + local_940);
                } while (lVar21 < (long)(local_a30[2] - local_9e0[2]));
              }
              break;
            case 0x3ec:
              if ((long)local_a30[0] < 2) {
                dVar24 = (double)(&local_788)[lVar11];
                if (dVar24 < 100000.0) goto LAB_0015c680;
                pcVar13 = " %.5e";
                goto LAB_0015c6fd;
              }
              if ((long)local_9e0[2] <= (long)local_a30[2]) {
                lVar21 = -1;
                pdVar18 = local_958;
                do {
                  pcVar13 = " %11.5f";
                  if (100000.0 <= *pdVar18) {
                    pcVar13 = " %.5e";
                  }
                  fprintf((FILE *)file,pcVar13);
                  lVar21 = lVar21 + 1;
                  pdVar18 = (double *)((long)pdVar18 + local_9e0[0]);
                } while (lVar21 < (long)(local_a30[2] - local_9e0[2]));
              }
              break;
            default:
              pnga_error("ga_print: wrong data type",0);
              break;
            case 0x3ee:
              if ((long)local_a30[0] < 2) {
                dVar24 = (double)*(float *)(&local_428 + lVar11);
                lVar21 = lVar11 * 2 + 1;
                if ((100000.0 <= *(float *)(&local_428 + lVar11)) ||
                   (fVar1 = *(float *)((long)&local_428 + lVar21 * 4), 100000.0 <= fVar1)) {
                  dVar26 = (double)*(float *)((long)&local_428 + lVar21 * 4);
                  goto LAB_0015c6e0;
                }
                dVar26 = (double)fVar1;
LAB_0015c6c8:
                pcVar13 = " %11.5f,%11.5f";
LAB_0015c6ea:
                fprintf((FILE *)file,pcVar13,dVar24,dVar26);
              }
              else if ((long)local_9e0[2] <= (long)local_a30[2]) {
                lVar21 = -1;
                pfVar20 = pfVar22;
                do {
                  if (100000.0 <= pfVar20[-1]) {
LAB_0015c585:
                    fVar1 = *pfVar20;
                    pcVar13 = " %.5e,%.5e";
                  }
                  else {
                    fVar1 = *pfVar20;
                    pcVar13 = " %11.5f,%11.5f";
                    if (100000.0 <= fVar1) goto LAB_0015c585;
                  }
                  fprintf((FILE *)file,pcVar13,(double)pfVar20[-1],(double)fVar1);
                  lVar21 = lVar21 + 1;
                  pfVar20 = (float *)((long)pfVar20 + local_9e0[0]);
                } while (lVar21 < (long)(local_a30[2] - local_9e0[2]));
              }
              break;
            case 0x3ef:
              if ((long)local_a30[0] < 2) {
                dVar24 = local_278[lVar11 * 2];
                lVar21 = lVar11 * 2 + 1;
                if ((dVar24 < 100000.0) && (dVar26 = local_278[lVar21], dVar26 < 100000.0))
                goto LAB_0015c6c8;
                dVar26 = local_278[lVar21];
LAB_0015c6e0:
                pcVar13 = " %.5e,%.5e";
                goto LAB_0015c6ea;
              }
              if ((long)local_9e0[2] <= (long)local_a30[2]) {
                lVar21 = -1;
                pdVar18 = pdVar12;
                do {
                  if ((100000.0 <= pdVar18[-1]) || (100000.0 <= *pdVar18)) {
                    pcVar13 = " %.5e,%.5e";
                  }
                  else {
                    pcVar13 = " %11.5f,%11.5f";
                  }
                  fprintf((FILE *)file,pcVar13);
                  lVar21 = lVar21 + 1;
                  pdVar18 = (double *)((long)pdVar18 + local_8f0);
                } while (lVar21 < (long)(local_a30[2] - local_9e0[2]));
              }
              break;
            case 0x3f8:
              if ((long)local_a30[0] < 2) {
                dVar24 = local_668[lVar11];
                pcVar13 = " %8lld";
                goto LAB_0015c64f;
              }
              if ((long)local_9e0[2] <= (long)local_a30[2]) {
                lVar21 = -1;
                do {
                  fprintf((FILE *)file," %8lld",*pdVar19);
                  lVar21 = lVar21 + 1;
                  pdVar19 = (double *)((long)pdVar19 + local_9e0[0]);
                } while (lVar21 < (long)(local_a30[2] - local_9e0[2]));
              }
            }
            fputc(10,(FILE *)file);
            pfVar22 = pfVar22 + 2;
            pdVar12 = pdVar12 + 2;
            pdVar17 = (double *)((long)local_960 + 4);
            pdVar15 = local_958 + 1;
            pdVar19 = local_950 + 1;
            local_968 = local_968 + 1;
            pdVar18 = (double *)((long)local_948 + 4);
            bVar6 = lVar11 < (long)(local_a30[1] - local_9e0[1]);
            lVar11 = lVar11 + 1;
          } while (bVar6);
        }
        lVar8 = local_970;
        plVar23 = local_998;
        local_9e0[1] = local_a30[1] + 1;
        local_a30[1] = local_a30[1] + local_970;
        if (*local_998 <= (long)local_a30[1]) {
          local_a30[1] = *local_998;
        }
        lVar21 = local_8f8;
        lVar11 = local_900;
      } while ((long)local_a30[0] < 1);
      bVar6 = true;
      uVar7 = 0;
LAB_0015c7cb:
      do {
        uVar9 = uVar7 + 1;
        uVar10 = plVar23[uVar7];
        if ((long)uVar10 < (long)local_9e0[uVar9]) {
          if (uVar9 == local_a30[0]) {
            bVar6 = false;
            uVar7 = uVar9;
            if (uVar9 == local_a30[0]) goto LAB_0015ccd1;
            goto LAB_0015c7cb;
          }
          uVar2 = local_988[uVar7];
          local_9e0[uVar9] = uVar2;
          if (uVar7 < 2) {
            uVar16 = uVar2 + local_978;
            if ((long)uVar10 <= (long)(uVar2 + local_978)) {
              uVar16 = uVar10;
            }
            local_a30[uVar9] = uVar16;
            if (uVar9 != 1) goto LAB_0015c85b;
            local_9e0[2] = local_a30[2] + 1;
            lVar14 = local_a30[2] + lVar8;
            if (plVar23[1] <= (long)(local_a30[2] + lVar8)) {
              lVar14 = plVar23[1];
            }
            local_a30[2] = lVar14;
          }
          else {
            local_a30[uVar9] = uVar2;
LAB_0015c85b:
            local_9e0[uVar7 + 2] = local_9e0[uVar7 + 2] + 1;
            local_a30[uVar7 + 2] = local_a30[uVar7 + 2] + 1;
          }
          if (uVar9 == 1) {
            lVar11 = 1;
          }
          if (uVar9 == 2) {
            lVar21 = 1;
          }
        }
        uVar7 = uVar9;
      } while (uVar9 != local_a30[0]);
    } while (bVar6);
  }
LAB_0015ccd1:
  fflush((FILE *)file);
LAB_0015ccd9:
  pnga_sync();
  return;
}

Assistant:

void pnga_print_patch_file(file, g_a, lo, hi, pretty)
        Integer g_a, *lo, *hi, pretty;
        FILE *file;
/*
  Pretty = 0 ... spew output out with no formatting
  Pretty = 1 ... format output so that it is readable
*/  
{
#define BUFSIZE 6
#define FLEN 80 

    Integer i, j;
    Integer type;
    char *name;
    Integer ndim, dims[MAXDIM], ld[MAXDIM];
    Integer bufsize;
    int ibuf[BUFSIZE], ibuf_2d[BUFSIZE*BUFSIZE];
    DoublePrecision dbuf[BUFSIZE], dbuf_2d[BUFSIZE*BUFSIZE];
    DoublePrecision dcbuf[2*BUFSIZE], dcbuf_2d[2*BUFSIZE*BUFSIZE];
    float fbuf[BUFSIZE], fbuf_2d[BUFSIZE*BUFSIZE];
    float fcbuf[2*BUFSIZE], fcbuf_2d[3*BUFSIZE*BUFSIZE];
    Integer lop[MAXDIM], hip[MAXDIM];
    long lbuf[BUFSIZE], lbuf_2d[BUFSIZE*BUFSIZE];
    long long llbuf[BUFSIZE], llbuf_2d[BUFSIZE*BUFSIZE];
    Integer done, status_2d, status_3d;
    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    pnga_sync();
    pnga_check_handle(g_a, "nga_print");

    /* only the first process print the array */
    if(pnga_nodeid() == 0) {
        
        pnga_inquire(g_a,  &type, &ndim, dims);
        pnga_inquire_name(g_a, &name);
        
        /* check the boundary */
        for(i=0; i<ndim; i++)
            if(lo[i] <= 0 || hi[i] > dims[i]) 
                pnga_error("g_a indices out of range ", g_a);
        
        /* print the general information */
        fprintf(file,"\n global array: %s[", name);
        for(i=0; i<ndim; i++)
            if(i != (ndim-1))
                fprintf(file, "%ld:%ld,", (long)lo[i], (long)hi[i]);
            else
                fprintf(file, "%ld:%ld",  (long)lo[i], (long)hi[i]);
        fprintf(file,"],  handle: %d \n", (int)g_a);
        
        bufsize = (type==C_DCPL)? BUFSIZE/2 : BUFSIZE;
        bufsize = (type==C_SCPL)? BUFSIZE/2 : BUFSIZE;
        
        for(i=0; i<ndim; i++) ld[i] = bufsize;
        
        if(!pretty) {
            done = 1;
            for(i=0; i<ndim; i++) {
                lop[i] = lo[i]; hip[i] = lo[i];
            }
            hip[0] = GA_MIN(lop[0]+bufsize-1, hi[0]);
            while(done) {
                switch(type) {
                    case C_INT:      pnga_get(g_a, lop, hip, ibuf, ld); break;
                    case C_DBL:      pnga_get(g_a, lop, hip, dbuf, ld); break;
                    case C_DCPL:     pnga_get(g_a, lop, hip, dcbuf, ld); break;
                    case C_FLOAT:    pnga_get(g_a, lop, hip, fbuf, ld); break; 
                    case C_SCPL:     pnga_get(g_a, lop, hip, fcbuf, ld); break;
                    case C_LONG:     pnga_get(g_a, lop, hip, lbuf, ld); break; 
                    case C_LONGLONG: pnga_get(g_a, lop, hip, llbuf,ld); break;
                    default: pnga_error("ga_print: wrong type",0);
                }
                
                /* print the array */
                for(i=0; i<(hip[0]-lop[0]+1); i++) {
                    fprintf(file,"%s(", name);
                    for(j=0; j<ndim; j++)
                        if((j == 0) && (j == (ndim-1)))
                            fprintf(file, "%ld", (long)lop[j]+i);
                        else if((j != 0) && (j == (ndim-1)))
                            fprintf(file, "%ld", (long)lop[j]);
                        else if((j == 0) && (j != (ndim-1)))
                            fprintf(file, "%ld,", (long)lop[j]+i);
                        else fprintf(file, "%ld,", (long)lop[j]);
                    switch(type) {
                        case C_INT:
                            fprintf(file,") = %d\n", ibuf[i]);break;
                        case C_LONG:
                            fprintf(file,") = %ld\n", lbuf[i]);break;
                        case C_LONGLONG:
                            fprintf(file,") = %lld\n", llbuf[i]);break;
                        case C_DBL:
                            if((double)dbuf[i]<100000.0)
                                fprintf(file,") = %f\n", dbuf[i]);
                            else fprintf(file,") = %e\n", dbuf[i]);
                            break;
                        case C_DCPL:
                            if(((double)dcbuf[i*2]<100000.0) &&
                               ((double)dcbuf[i*2+1]<100000.0))
                                fprintf(file,") = (%f,%f)\n",
                                        dcbuf[i*2],dcbuf[i*2+1]);
                            else
                                fprintf(file,") = (%e,%e)\n",
                                        dcbuf[i*2],dcbuf[i*2+1]);
                            break;
                        case C_SCPL:
                            if(((float)fcbuf[i*2]<100000.0) &&
                               ((float)fcbuf[i*2+1]<100000.0))
                                fprintf(file,") = (%f,%f)\n",
                                        fcbuf[i*2],fcbuf[i*2+1]);
                            else
                                fprintf(file,") = (%e,%e)\n",
                                        fcbuf[i*2],fcbuf[i*2+1]);
                            break;
                        case C_FLOAT: fprintf(file,") = %f\n", fbuf[i]);break; 
                    }
                }
                
                fflush(file);
                
                lop[0] = hip[0]+1; hip[0] = GA_MIN(lop[0]+bufsize-1, hi[0]);
                
                for(i=0; i<ndim; i++) {
                    if(lop[i] > hi[i]) {
                        if(i == (ndim-1)) {
                            done = 0;
                        } else {
                            lop[i] = lo[i];
                            if(i == 0) hip[i] = GA_MIN(lop[i]+bufsize-1, hi[i]);
                            else hip[i] = lo[i];
                            lop[i+1]++; hip[i+1]++;
                        }
                    }
                }
            }
        }
        else {
            /* pretty print */
            done = 1;
            for(i=0; i<ndim; i++) {
                lop[i] = lo[i];
                if((i == 0) || (i == 1))
                    hip[i] = GA_MIN(lop[i]+bufsize-1, hi[i]);
                else 
                    hip[i] = lo[i];
            }
            
            status_2d = 1; status_3d = 1;
            
            while(done) {
                if(status_3d && (ndim > 2)) { /* print the patch info */
                    fprintf(file,"\n -- patch: %s[", name);
                    for(i=0; i<ndim; i++)
                        if(i < 2)
                            if(i != (ndim-1))
                                fprintf(file, "%ld:%ld,", (long)lo[i], (long)hi[i]);
                            else
                                fprintf(file, "%ld:%ld", (long)lo[i], (long)hi[i]);
                        else
                            if(i != (ndim-1))
                                fprintf(file, "%ld,", (long)lop[i]);
                            else
                                fprintf(file, "%ld", (long)lop[i]);
                    fprintf(file,"]\n"); status_3d = 0;
                }
                
                if(status_2d &&(ndim > 1)) {
                    fprintf(file, "\n"); 
                    switch(type) {
                        case C_INT:
                            fprintf(file, "     ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%7ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," --------");
                            break;
                        case C_LONG:
                            fprintf(file, "     ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%7ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," --------");
                            break;
                        case C_LONGLONG:
                            fprintf(file, "     ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%7ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," --------");
                            break;
                        case C_DBL:
                            fprintf(file, "   ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%10ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," -----------");
                            break;
                        case C_DCPL:
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%22ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," -----------------------");
                            break;
                        case C_SCPL:
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%22ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," -----------------------");
                            break;
                        case C_FLOAT:
                            fprintf(file, "     ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file, "%7ld  ", (long)i);
                            fprintf(file,"\n      ");
                            for (i=lop[1]; i<=hip[1]; i++)
                                fprintf(file," --------");
                            break;
                       default:
                         pnga_error("ga_print: wrong type", 0);
                    }
                    
                    fprintf(file,"\n");
                    status_2d = 0;
                }
                
                switch(type) {
                    case C_INT: pnga_get(g_a, lop, hip, ibuf_2d, ld); break;
                    case C_LONG: pnga_get(g_a, lop, hip,lbuf_2d, ld); break;
                    case C_LONGLONG: pnga_get(g_a, lop, hip,llbuf_2d,ld);break;
                    case C_DBL: pnga_get(g_a, lop, hip, dbuf_2d, ld); break;
                    case C_DCPL: pnga_get(g_a, lop, hip, dcbuf_2d, ld);break;
                    case C_FLOAT: pnga_get(g_a, lop, hip, fbuf_2d, ld);break;
                    case C_SCPL: pnga_get(g_a, lop, hip, fcbuf_2d, ld);break;  
                   default: pnga_error("ga_print: wrong type",0);
                }
                
                for(i=0; i<(hip[0]-lop[0]+1); i++) {
                    fprintf(file,"%4ld  ", (long)(lop[0]+i));
                    switch(type) {
                        case C_INT:
                            if(ndim > 1)
                                for(j=0; j<(hip[1]-lop[1]+1); j++)
                                    fprintf(file," %8d", ibuf_2d[j*bufsize+i]);
                            else fprintf(file," %8d", ibuf_2d[i]);
                            break;
                        case C_LONG:
                            if(ndim > 1)
                                for(j=0; j<(hip[1]-lop[1]+1); j++)
                                    fprintf(file," %8ld",lbuf_2d[j*bufsize+i]);
                            else fprintf(file," %8ld",lbuf_2d[i]);
                            break;
                        case C_LONGLONG:
                            if(ndim > 1)
                               for(j=0; j<(hip[1]-lop[1]+1); j++)
                                  fprintf(file," %8lld",llbuf_2d[j*bufsize+i]);
                            else fprintf(file," %8lld",llbuf_2d[i]);
                            break;
                        case C_DBL:
                            if(ndim > 1)
                                for(j=0; j<(hip[1]-lop[1]+1); j++)
                                    if((double)dbuf_2d[j*bufsize+i]<100000.0)
                                        fprintf(file," %11.5f",
                                                dbuf_2d[j*bufsize+i]);
                                    else
                                        fprintf(file," %.5e",
                                                dbuf_2d[j*bufsize+i]);
                            else
                                if((double)dbuf_2d[i]<100000.0)
                                    fprintf(file," %11.5f",dbuf_2d[i]);
                                else
                                    fprintf(file," %.5e",dbuf_2d[i]);
                            break;
                        case C_FLOAT:
                            if(ndim > 1)
                                for(j=0; j<(hip[1]-lop[1]+1); j++)
                                    fprintf(file," %11.5f", fbuf_2d[j*bufsize+i]);
                            else fprintf(file," %11.5f", fbuf_2d[i]);
                            break;           
                        case C_DCPL:
                            if(ndim > 1)
                                for(j=0; j<(hip[1]-lop[1]+1); j++)
                                    if(((double)dcbuf_2d[(j*bufsize+i)*2]<100000.0)&&((double)dcbuf_2d[(j*bufsize+i)*2+1]<100000.0))
                                        fprintf(file," %11.5f,%11.5f",
                                                dcbuf_2d[(j*bufsize+i)*2],
                                                dcbuf_2d[(j*bufsize+i)*2+1]);
                                    else
                                        fprintf(file," %.5e,%.5e",
                                                dcbuf_2d[(j*bufsize+i)*2],
                                                dcbuf_2d[(j*bufsize+i)*2+1]);
                            else
                                if(((double)dcbuf_2d[i*2]<100000.0) &&
                                   ((double)dcbuf_2d[i*2+1]<100000.0))
                                    fprintf(file," %11.5f,%11.5f",
                                            dcbuf_2d[i*2], dcbuf_2d[i*2+1]);
                                else
                                    fprintf(file," %.5e,%.5e",
                                            dcbuf_2d[i*2], dcbuf_2d[i*2+1]);
			    break;
                        case C_SCPL:
                            if(ndim > 1)
                                for(j=0; j<(hip[1]-lop[1]+1); j++)
                                    if(((float)fcbuf_2d[(j*bufsize+i)*2]<100000.0)&&((float)fcbuf_2d[(j*bufsize+i)*2+1]<100000.0))
                                        fprintf(file," %11.5f,%11.5f",
                                                fcbuf_2d[(j*bufsize+i)*2],
                                                fcbuf_2d[(j*bufsize+i)*2+1]);
                                    else
                                        fprintf(file," %.5e,%.5e",
                                                fcbuf_2d[(j*bufsize+i)*2],
                                                fcbuf_2d[(j*bufsize+i)*2+1]);
                            else
                                if(((float)fcbuf_2d[i*2]<100000.0) &&
                                   ((float)fcbuf_2d[i*2+1]<100000.0))
                                    fprintf(file," %11.5f,%11.5f",
                                            fcbuf_2d[i*2], fcbuf_2d[i*2+1]);
                                else
                                    fprintf(file," %.5e,%.5e",
                                            fcbuf_2d[i*2], fcbuf_2d[i*2+1]);
                            break;
                       default:
                          pnga_error("ga_print: wrong data type", 0);
                    }
                    
                    fprintf(file,"\n");
                }
                
                lop[0] = hip[0]+1; hip[0] = GA_MIN(lop[0]+bufsize-1, hi[0]);
                
                for(i=0; i<ndim; i++) {
                    if(lop[i] > hi[i]) {
                        if(i == (ndim-1)) {
                            done = 0;
                        } else {
                            lop[i] = lo[i];
                            
                            if((i == 0) || (i == 1)) {
                                hip[i] = GA_MIN(lop[i]+bufsize-1, hi[i]);
                            } else {
                                hip[i] = lo[i];
                            }
                            
                            if(i == 0) {
                                lop[i+1] = hip[i+1]+1;
                                hip[i+1] = GA_MIN(lop[i+1]+bufsize-1, hi[i+1]);
                            } else {
                                lop[i+1]++; hip[i+1]++;
                            }
                            
                            if(i == 0) status_2d = 1;
                            if(i == 1) status_3d = 1;
                        }
                    }
                }
            }
        }
        fflush(file);
    }
    
    pnga_sync();
}